

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O2

int archive_read_format_7zip_read_header(archive_read *a,archive_entry *entry)

{
  uint32_t **ppuVar1;
  _7z_coders_info *val;
  uint *puVar2;
  _7z_stream_info *si;
  long lVar3;
  uint64_t uVar4;
  _7z_stream_info *si_00;
  size_t sVar5;
  uchar uVar6;
  wchar_t wVar7;
  int iVar8;
  int iVar9;
  uchar *p;
  int64_t iVar10;
  uint32_t *puVar11;
  archive_string_conv *paVar12;
  int *piVar13;
  undefined8 *__ptr;
  undefined8 *puVar14;
  char *pcVar15;
  uchar *puVar16;
  undefined8 extraout_RAX;
  byte *pbVar17;
  uint64_t *puVar18;
  void *pvVar19;
  uchar *puVar20;
  _7z_coder *p_Var21;
  _7z_coder *p_Var22;
  char *pcVar23;
  ulong uVar24;
  char *pcVar25;
  uint uVar26;
  uint uVar27;
  uint64_t uVar28;
  ulong uVar29;
  uint uVar30;
  uint uVar31;
  long lVar33;
  ulong uVar34;
  size_t sVar35;
  size_t b;
  _7z_folder *p_Var36;
  byte bVar37;
  uint uVar38;
  _7z_folder *p_Var39;
  bool bVar40;
  uint64_t *local_d8;
  uint64_t size;
  _7z_folder *local_a8;
  undefined4 local_9c;
  uchar *local_98;
  int64_t offset;
  _7z_header_info header;
  ulong uVar32;
  
  si = (_7z_stream_info *)a->format->data;
  if ((int)si[0xc6].ss.unpack_streams == -1) {
    *(undefined4 *)&si[0xc6].ss.unpack_streams = 0;
  }
  (a->archive).archive_format = 0xe0000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "7-Zip";
  }
  if (si[1].ci.folders == (_7z_folder *)0x0) {
    header.emptyFileBools = (uchar *)0x0;
    header.antiBools = (uchar *)0x0;
    header.dataIndex = 0;
    header.emptyStreamBools = (uchar *)0x0;
    header.attrBools = (uchar *)0x0;
    piVar13 = (int *)__archive_read_ahead(a,0x20,&offset);
    if (piVar13 == (int *)0x0) {
LAB_002290ab:
      iVar9 = -0x1e;
      bVar40 = false;
    }
    else {
      if ((((char)*piVar13 == 'M') && (*(char *)((long)piVar13 + 1) == 'Z')) ||
         (*piVar13 == 0x464c457f)) {
        if (offset < 0x27001) {
          iVar10 = __archive_read_seek(a,0x27000,0);
          if (iVar10 < 0) goto LAB_002290ab;
        }
        else {
          __archive_read_consume(a,0x27000);
        }
        lVar33 = 0;
        uVar34 = 1;
        do {
          while( true ) {
            uVar32 = uVar34;
            if (0x39000 < uVar32 + lVar33) goto LAB_0022908a;
            pcVar23 = (char *)__archive_read_ahead(a,uVar32,(ssize_t *)&size);
            if (pcVar23 == (char *)0x0) break;
            uVar34 = 0x1000;
            if (5 < (long)size) {
              pcVar25 = pcVar23 + size;
              for (pcVar15 = pcVar23; pcVar15 + 0x20 < pcVar25; pcVar15 = pcVar15 + uVar26) {
                uVar26 = check_7zip_header_in_sfx(pcVar15);
                if (uVar26 == 0) {
                  pvVar19 = a->format->data;
                  __archive_read_consume(a,(long)pcVar15 - (long)pcVar23);
                  *(long *)((long)pvVar19 + 0x88) =
                       lVar33 + ((long)pcVar15 - (long)pcVar23) + 0x27000;
                  piVar13 = (int *)__archive_read_ahead(a,0x20,&offset);
                  if (piVar13 != (int *)0x0) goto LAB_00228f73;
                  goto LAB_002290ab;
                }
              }
              __archive_read_consume(a,(long)pcVar15 - (long)pcVar23);
              lVar33 = lVar33 + ((long)pcVar15 - (long)pcVar23);
              uVar34 = uVar32;
              if (uVar32 == 1) {
                uVar34 = 0x1000;
              }
            }
          }
          uVar34 = uVar32 >> 1;
        } while (0x7f < uVar32);
LAB_0022908a:
        archive_set_error(&a->archive,0x54,"Couldn\'t find out 7-Zip header");
        goto LAB_002290ab;
      }
LAB_00228f73:
      iVar9 = -0x1e;
      ppuVar1 = &si[1].pi.digest.digests;
      *ppuVar1 = *ppuVar1 + 8;
      iVar8 = bcmp(piVar13,anon_var_dwarf_16abb7,6);
      if (iVar8 == 0) {
        uVar34 = crc32(0,piVar13 + 3,0x14);
        if (uVar34 != (uint)piVar13[2]) {
          pcVar23 = "Header CRC error";
          goto LAB_00229157;
        }
        uVar28 = *(uint64_t *)(piVar13 + 5);
        if (uVar28 == 0) {
          iVar9 = 1;
          bVar40 = false;
        }
        else {
          puVar18 = *(uint64_t **)(piVar13 + 3);
          if ((long)puVar18 < 0) {
LAB_0022a178:
            pcVar23 = "Malformed 7-Zip archive";
LAB_0022a17f:
            iVar9 = -1;
LAB_0022a18b:
            archive_set_error(&a->archive,iVar9,pcVar23);
          }
          else {
            local_d8 = (uint64_t *)(ulong)(uint)piVar13[7];
            __archive_read_consume(a,0x20);
            if (puVar18 == (uint64_t *)0x0) {
LAB_00229612:
              si[2].pi.positions = puVar18;
              si[1].pi.digest.defineds = (uchar *)puVar18;
              si[1].pi.numPackStreams = uVar28;
              si[1].pi.sizes = (uint64_t *)0x0;
              si[1].pi.pos = 1;
              *(undefined4 *)&si[0xc6].ss.unpack_streams = 0;
              puVar16 = header_bytes(a,1);
              if (puVar16 != (uchar *)0x0) {
                if (*puVar16 == '\x17') {
                  pvVar19 = a->format->data;
                  piVar13 = __errno_location();
                  *piVar13 = 0;
                  iVar9 = read_StreamsInfo(a,si);
                  if (iVar9 < 0) {
                    pcVar23 = "Malformed 7-Zip archive";
                    if (*piVar13 == 0xc) {
                      pcVar23 = "Couldn\'t allocate memory";
                    }
LAB_00229785:
                    archive_set_error(&a->archive,-1,pcVar23);
                    iVar9 = -0x1e;
LAB_00229798:
                    bVar40 = true;
                  }
                  else {
                    pcVar23 = "Malformed 7-Zip archive";
                    if (((si->pi).numPackStreams == 0) || ((si->ci).numFolders == 0))
                    goto LAB_00229785;
                    uVar28 = (si->pi).pos;
                    pcVar23 = "Malformed Header offset";
                    if ((((long)uVar28 < 0) ||
                        ((uVar4 = *(si->pi).sizes, uVar4 == 0 ||
                         (uVar34 = uVar4 + uVar28, *(ulong *)((long)pvVar19 + 0x80) < uVar34)))) ||
                       ((long)uVar34 < 0)) goto LAB_00229785;
                    if (si[1].pi.sizes != local_d8) {
                      iVar9 = -1;
                      archive_set_error(&a->archive,-1,"Damaged 7-Zip archive");
                      goto LAB_00229798;
                    }
                    p_Var39 = (si->ci).folders;
                    bVar40 = p_Var39->digest_defined != '\0';
                    if (bVar40) {
                      local_d8 = (uint64_t *)(ulong)p_Var39->digest;
                    }
                    if (si[2].ss.unpackSizes != (uint64_t *)0x0) {
                      read_consume(a);
                      p_Var39 = (si->ci).folders;
                    }
                    iVar9 = setup_decode_folder(a,p_Var39,1);
                    if (iVar9 == 0) {
                      si[1].pi.numPackStreams = (uint64_t)si[2].ci.folders;
                      iVar9 = seek_pack(a);
                    }
                  }
                  free_StreamsInfo(si);
                  (si->ss).unpackSizes = (uint64_t *)0x0;
                  (si->ss).digestsDefined = (uchar *)0x0;
                  (si->ci).dataStreamIndex = 0;
                  (si->ss).unpack_streams = 0;
                  (si->ci).numFolders = 0;
                  (si->ci).folders = (_7z_folder *)0x0;
                  (si->pi).digest.digests = (uint32_t *)0x0;
                  (si->pi).positions = (uint64_t *)0x0;
                  (si->pi).sizes = (uint64_t *)0x0;
                  (si->pi).digest.defineds = (uchar *)0x0;
                  (si->pi).pos = 0;
                  (si->pi).numPackStreams = 0;
                  (si->ss).digests = (uint32_t *)0x0;
                  if (iVar9 < 0) goto LAB_0022a197;
                  *(undefined4 *)((long)&si[1].pi.pos + 4) = 1;
                  si[1].pi.sizes = (uint64_t *)0x0;
                  local_9c = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),!bVar40);
                }
                else {
                  if (*puVar16 != '\x01') {
                    archive_set_error(&a->archive,-1,"Unexpected Property ID = %X");
                    goto LAB_0022a197;
                  }
                  local_9c = 0;
                  piVar13 = __errno_location();
                }
                *piVar13 = 0;
                si_00 = (_7z_stream_info *)a->format->data;
                if (((*(int *)((long)&si[1].pi.pos + 4) == 0) ||
                    ((puVar16 = header_bytes(a,1), puVar16 != (uchar *)0x0 && (*puVar16 == '\x01')))
                    ) && (puVar16 = header_bytes(a,1), puVar16 != (uchar *)0x0)) {
                  uVar6 = *puVar16;
                  if (uVar6 == '\x02') {
                    do {
                      puVar16 = header_bytes(a,1);
                      if (puVar16 == (uchar *)0x0) break;
                      if (*puVar16 == '\0') {
                        puVar16 = header_bytes(a,1);
                        if (puVar16 != (uchar *)0x0) {
                          uVar6 = *puVar16;
                          goto LAB_002298aa;
                        }
                        break;
                      }
                      iVar9 = parse_7zip_uint64(a,&size);
                    } while (-1 < iVar9);
                  }
                  else {
LAB_002298aa:
                    if (uVar6 == '\x04') {
                      iVar9 = read_StreamsInfo(a,si_00);
                      if ((iVar9 < 0) || (puVar16 = header_bytes(a,1), puVar16 == (uchar *)0x0))
                      goto LAB_00229ec0;
                      uVar6 = *puVar16;
                    }
                    if (uVar6 == '\0') {
LAB_0022a106:
                      puVar16 = header_bytes(a,1);
                      if ((puVar16 != (uchar *)0x0) && (*puVar16 == '\0')) {
                        if (((char)local_9c != '\0') || (si[1].pi.sizes == local_d8)) {
                          si[2].pi.digest.digests = (uint32_t *)0x0;
                          si[2].ss.unpackSizes = (uint64_t *)0x0;
                          *(undefined4 *)&si[1].pi.pos = 0;
                          si[2].ci.folders = (_7z_folder *)0x0;
                          si[2].ci.dataStreamIndex = 0;
                          iVar9 = 0;
                          bVar40 = true;
                          goto LAB_00229167;
                        }
                        goto LAB_0022a178;
                      }
                      pcVar23 = "Malformed 7-Zip archive";
                      iVar9 = -1;
                      goto LAB_0022a18b;
                    }
                    if (uVar6 == '\x05') {
                      val = &si_00[1].ci;
                      iVar9 = parse_7zip_uint64(a,&val->numFolders);
                      if ((-1 < iVar9) && (val->numFolders < 0x5f5e101)) {
                        local_a8 = (_7z_folder *)calloc(val->numFolders,0x50);
                        si_00[1].ci.folders = local_a8;
                        if (local_a8 != (_7z_folder *)0x0) {
                          uVar26 = 0;
LAB_00229959:
                          do {
                            pbVar17 = header_bytes(a,1);
                            if (pbVar17 == (byte *)0x0) break;
                            bVar37 = *pbVar17;
                            if (bVar37 == 0) {
                              p_Var39 = (si_00->ci).folders;
                              uVar26 = 0;
                              uVar31 = 0;
                              uVar30 = 0;
                              iVar8 = 0;
                              iVar9 = 0;
                              goto LAB_00229f10;
                            }
                            iVar9 = parse_7zip_uint64(a,&size);
                            uVar28 = size;
                            if ((iVar9 < 0) || (si_00[1].pi.numPackStreams < size)) break;
                            if (bVar37 - 0xe < 0xc) {
                              uVar34 = (ulong)uVar26;
                              switch((uint)bVar37) {
                              case 0xe:
                                if (header.emptyStreamBools != (uchar *)0x0) goto LAB_00229ec0;
                                sVar5 = val->numFolders;
                                puVar16 = (uchar *)calloc(sVar5,1);
                                header.emptyStreamBools = puVar16;
                                if ((puVar16 == (uchar *)0x0) ||
                                   (iVar9 = read_Bools(a,puVar16,sVar5), iVar9 < 0))
                                goto LAB_00229ec0;
                                uVar26 = 0;
                                for (uVar30 = 0; (ulong)uVar30 < val->numFolders;
                                    uVar30 = uVar30 + 1) {
                                  uVar26 = (uVar26 + 1) - (uint)(puVar16[uVar30] == '\0');
                                }
                                goto LAB_00229959;
                              case 0xf:
                                if (0 < (int)uVar26) {
                                  if (header.emptyFileBools != (uchar *)0x0) goto LAB_00229ec0;
                                  puVar16 = (uchar *)calloc(uVar34,1);
                                  header.emptyFileBools = puVar16;
LAB_00229c15:
                                  if ((puVar16 == (uchar *)0x0) ||
                                     (iVar9 = read_Bools(a,puVar16,uVar34), iVar9 < 0))
                                  goto LAB_00229ec0;
                                  goto LAB_00229959;
                                }
                                break;
                              case 0x10:
                                if (0 < (int)uVar26) {
                                  if (header.antiBools == (uchar *)0x0) {
                                    puVar16 = (uchar *)calloc(uVar34,1);
                                    header.antiBools = puVar16;
                                    goto LAB_00229c15;
                                  }
                                  goto LAB_00229ec0;
                                }
                                break;
                              case 0x11:
                                puVar16 = header_bytes(a,1);
                                if ((((puVar16 == (uchar *)0x0) ||
                                     (uVar34 = uVar28 - 1, (uVar34 & 1) != 0)) ||
                                    (uVar34 < val->numFolders << 2)) ||
                                   (si_00[1].ss.unpack_streams != 0)) goto LAB_00229ec0;
                                pvVar19 = malloc(uVar34);
                                si_00[1].ss.unpack_streams = (size_t)pvVar19;
                                uVar32 = uVar34;
                                if (pvVar19 == (void *)0x0) goto LAB_00229ec0;
                                for (; uVar32 != 0; uVar32 = uVar32 - sVar35) {
                                  sVar35 = 0x10000;
                                  if (uVar32 < 0x10000) {
                                    sVar35 = uVar32;
                                  }
                                  puVar16 = header_bytes(a,sVar35);
                                  if (puVar16 == (uchar *)0x0) goto LAB_00229ec0;
                                  memcpy(pvVar19,puVar16,sVar35);
                                  pvVar19 = (void *)((long)pvVar19 + sVar35);
                                }
                                uVar32 = si_00[1].ci.numFolders;
                                p_Var21 = (_7z_coder *)si_00[1].ss.unpack_streams;
                                for (uVar30 = 0; uVar24 = (ulong)uVar30, uVar24 < uVar32;
                                    uVar30 = uVar30 + 1) {
                                  (&local_a8->coders)[uVar24 * 10] = p_Var21;
                                  uVar28 = 0;
                                  uVar29 = uVar34;
                                  p_Var22 = p_Var21;
                                  while( true ) {
                                    p_Var21 = (_7z_coder *)((long)&p_Var22->codec + 2);
                                    if (uVar29 < 2) goto LAB_00229ec0;
                                    if (((char)p_Var22->codec == '\0') &&
                                       (*(undefined1 *)((long)&p_Var22->codec + 1) == '\0')) break;
                                    uVar29 = uVar29 - 2;
                                    uVar28 = uVar28 + 2;
                                    p_Var22 = p_Var21;
                                  }
                                  (&local_a8->numCoders)[uVar24 * 10] = uVar28;
                                  uVar34 = (uVar34 - uVar28) - 2;
                                }
                                goto LAB_00229959;
                              default:
                                pvVar19 = a->format->data;
                                lVar33 = *(long *)((long)pvVar19 + 0xa0);
                                local_98 = (uchar *)calloc(*(size_t *)((long)pvVar19 + 0x98),1);
                                if (local_98 == (uchar *)0x0) goto LAB_00229ec0;
                                puVar20 = header_bytes(a,1);
                                puVar16 = local_98;
                                if (puVar20 != (uchar *)0x0) {
                                  if (*puVar20 == '\0') {
                                    iVar9 = read_Bools(a,local_98,*(size_t *)((long)pvVar19 + 0x98))
                                    ;
                                    if (iVar9 < 0) goto LAB_00229eb3;
                                  }
                                  else {
                                    memset(local_98,1,*(size_t *)((long)pvVar19 + 0x98));
                                  }
                                  puVar20 = header_bytes(a,1);
                                  if ((puVar20 != (uchar *)0x0) &&
                                     ((*puVar20 == '\0' ||
                                      ((iVar9 = parse_7zip_uint64(a,&header.dataIndex), -1 < iVar9
                                       && (header.dataIndex < 0x5f5e101)))))) {
                                    bVar37 = bVar37 - 0x12;
                                    for (uVar30 = 0; uVar34 = (ulong)uVar30,
                                        uVar34 < *(ulong *)((long)pvVar19 + 0x98);
                                        uVar30 = uVar30 + 1) {
                                      if (puVar16[uVar34] != '\0') {
                                        puVar18 = (uint64_t *)header_bytes(a,8);
                                        if (puVar18 == (uint64_t *)0x0) goto LAB_00229eb3;
                                        if (bVar37 < 3) {
                                          uVar31 = *(uint *)(&DAT_002ba5d8 + (ulong)bVar37 * 4);
                                          lVar3 = lVar33 + uVar34 * 0x50;
                                          ntfs_to_unix(*puVar18,(int64_t *)
                                                                (lVar3 + (ulong)(byte)(bVar37 * -8 +
                                                                                      0x30)),
                                                       (uint32_t *)
                                                       (lVar3 + (ulong)(byte)(bVar37 * -4 + 0x40)));
                                          puVar2 = (uint *)(lVar33 + 0x18 + uVar34 * 0x50);
                                          *puVar2 = *puVar2 | uVar31;
                                          puVar16 = local_98;
                                        }
                                      }
                                    }
                                    free(puVar16);
                                    goto LAB_00229959;
                                  }
                                }
LAB_00229eb3:
                                free(puVar16);
                                goto LAB_00229ec0;
                              case 0x15:
                                puVar16 = header_bytes(a,2);
                                if ((puVar16 == (uchar *)0x0) || (header.attrBools != (uchar *)0x0))
                                goto LAB_00229ec0;
                                uVar6 = *puVar16;
                                sVar5 = val->numFolders;
                                puVar16 = (uchar *)calloc(sVar5,1);
                                header.attrBools = puVar16;
                                if (puVar16 == (uchar *)0x0) goto LAB_00229ec0;
                                if (uVar6 == '\0') {
                                  iVar9 = read_Bools(a,puVar16,sVar5);
                                  if (iVar9 < 0) goto LAB_00229ec0;
                                }
                                else {
                                  memset(puVar16,1,sVar5);
                                }
                                for (uVar30 = 0; uVar34 = (ulong)uVar30, uVar34 < val->numFolders;
                                    uVar30 = uVar30 + 1) {
                                  if (puVar16[uVar34] != '\0') {
                                    puVar20 = header_bytes(a,4);
                                    if (puVar20 == (uchar *)0x0) goto LAB_00229ec0;
                                    *(undefined4 *)(&local_a8->digest_defined + uVar34 * 0x50) =
                                         *(undefined4 *)puVar20;
                                  }
                                }
                                goto LAB_00229959;
                              case 0x16:
                              case 0x17:
                              case 0x18:
                                break;
                              case 0x19:
                                if (size == 0) goto LAB_00229959;
                              }
                            }
                            puVar16 = header_bytes(a,size);
                          } while (puVar16 != (uchar *)0x0);
                        }
                      }
                    }
                  }
                }
LAB_00229ec0:
                if (*piVar13 == 0xc) {
                  pcVar23 = "Couldn\'t allocate memory";
                }
                else {
                  pcVar23 = "Damaged 7-Zip archive";
                }
                goto LAB_0022a17f;
              }
              pcVar23 = "Truncated 7-Zip file body";
              iVar9 = 0x54;
              goto LAB_0022a18b;
            }
            if ((long)puVar18 <= offset) {
              __archive_read_consume(a,(int64_t)puVar18);
              goto LAB_00229612;
            }
            iVar10 = __archive_read_seek(a,(long)si[1].pi.digest.digests + (long)puVar18,0);
            if (-1 < iVar10) goto LAB_00229612;
          }
LAB_0022a197:
          bVar40 = false;
          iVar9 = -0x1e;
        }
      }
      else {
        pcVar23 = "Not 7-Zip archive file";
LAB_00229157:
        bVar40 = false;
        archive_set_error(&a->archive,-1,pcVar23);
      }
    }
LAB_00229167:
    free(header.emptyStreamBools);
    free(header.emptyFileBools);
    free(header.antiBools);
    free(header.attrBools);
    if (!bVar40) {
      return iVar9;
    }
    puVar18 = (uint64_t *)si[1].ci.numFolders;
    p_Var39 = si[1].ci.folders;
    si[1].pi.positions = puVar18;
  }
  else {
    puVar18 = si[1].pi.positions;
    p_Var39 = (_7z_folder *)(si[1].ci.dataStreamIndex + 0x50);
  }
  si[1].ci.dataStreamIndex = (uint64_t)p_Var39;
  if (p_Var39 == (_7z_folder *)0x0 || puVar18 == (uint64_t *)0x0) {
    return 1;
  }
  si[1].pi.positions = (uint64_t *)((long)puVar18 + -1);
  si[1].ss.unpackSizes = (uint64_t *)0x0;
  *(undefined1 *)&si[2].pi.pos = 0;
  puVar11 = (uint32_t *)crc32(0,0,0);
  si[1].ss.digests = puVar11;
  if (si[0xc6].pi.pos == 0) {
    paVar12 = archive_string_conversion_from_charset((archive_conflict *)a,"UTF-16LE",L'\x01');
    si[0xc6].pi.pos = (uint64_t)paVar12;
    if (paVar12 != (archive_string_conv *)0x0) goto LAB_0022922c;
LAB_0022950c:
    iVar9 = -0x1e;
  }
  else {
LAB_0022922c:
    uVar34 = (ulong)(uint)p_Var39->numBindPairs;
    if ((uVar34 < (si->ci).numFolders) && (p_Var36 = (si->ci).folders, p_Var36 != (_7z_folder *)0x0)
       ) {
      p_Var36 = p_Var36 + uVar34;
      lVar33 = 0;
      for (uVar34 = 0; uVar34 < p_Var36->numCoders; uVar34 = uVar34 + 1) {
        lVar3 = *(long *)((long)&p_Var36->coders->codec + lVar33);
        if (((lVar3 == 0x6f10101) || (lVar3 == 0x6f10701)) || (lVar3 == 0x6f10303)) {
          archive_entry_set_is_data_encrypted(entry,'\x01');
          *(undefined4 *)&si[0xc6].ss.unpack_streams = 1;
        }
        lVar33 = lVar33 + 0x28;
      }
    }
    if ((int)si[0xc6].ss.unpack_streams == -1) {
      *(undefined4 *)&si[0xc6].ss.unpack_streams = 0;
    }
    wVar7 = _archive_entry_copy_pathname_l
                      (entry,(char *)p_Var39->coders,p_Var39->numCoders,
                       (archive_string_conv *)si[0xc6].pi.pos);
    if (wVar7 == L'\0') {
      iVar9 = 0;
    }
    else {
      piVar13 = __errno_location();
      if (*piVar13 == 0xc) {
        pcVar23 = "Can\'t allocate memory for Pathname";
LAB_002294fd:
        archive_set_error(&a->archive,0xc,pcVar23);
        goto LAB_0022950c;
      }
      pcVar23 = archive_string_conversion_charset_name((archive_string_conv *)si[0xc6].pi.pos);
      archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to current locale.",
                        pcVar23);
      iVar9 = -0x14;
    }
    archive_entry_set_mode(entry,*(mode_t *)((long)&p_Var39->unPackSize + 4));
    uVar26 = *(uint *)&p_Var39->bindPairs;
    if ((uVar26 & 1) != 0) {
      archive_entry_set_mtime(entry,p_Var39->numPackedStreams,(ulong)(uint)p_Var39->numOutStreams);
      uVar26 = *(uint *)&p_Var39->bindPairs;
    }
    if ((uVar26 & 4) != 0) {
      archive_entry_set_ctime(entry,p_Var39->numInStreams,(ulong)*(uint *)&p_Var39->unPackSize);
      uVar26 = *(uint *)&p_Var39->bindPairs;
    }
    if ((uVar26 & 2) != 0) {
      archive_entry_set_atime
                (entry,(time_t)p_Var39->packedStreams,
                 (ulong)*(uint *)((long)&p_Var39->numOutStreams + 4));
    }
    uVar34 = (ulong)*(uint *)((long)&p_Var39->numBindPairs + 4);
    if (uVar34 == 0xffffffff) {
      puVar16 = (uchar *)0x0;
    }
    else {
      puVar16 = (uchar *)(si->ss).unpackSizes[uVar34];
    }
    si[1].ss.digestsDefined = puVar16;
    archive_entry_set_size(entry,(la_int64_t)puVar16);
    uVar26 = *(uint *)&p_Var39->digest_defined;
    if (((uVar26 & 7) != 0) && (__ptr = (undefined8 *)malloc(0x16), __ptr != (undefined8 *)0x0)) {
      puVar14 = __ptr;
      if ((uVar26 & 1) != 0) {
        *__ptr = 0x796c6e6f64722c;
        puVar14 = (undefined8 *)((long)__ptr + 7);
      }
      if ((uVar26 & 2) != 0) {
        *puVar14 = 0x6e65646469682c;
        puVar14 = (undefined8 *)((long)puVar14 + 7);
      }
      if ((uVar26 & 4) != 0) {
        *puVar14 = 0x6d65747379732c;
        puVar14 = (undefined8 *)((long)puVar14 + 7);
      }
      if (__ptr < puVar14) {
        archive_entry_copy_fflags_text(entry,(char *)((long)__ptr + 1));
      }
      free(__ptr);
    }
    puVar16 = si[1].ss.digestsDefined;
    if (puVar16 == (uchar *)0x0) {
      *(undefined1 *)&si[2].pi.pos = 1;
    }
    if (((ulong)p_Var39->unPackSize & 0xf00000000000) == 0xa00000000000) {
      sVar35 = 0;
      pcVar23 = (char *)0x0;
      while (puVar16 != (uchar *)0x0) {
        iVar8 = archive_read_format_7zip_read_data(a,(void **)&header,&size,&offset);
        uVar28 = size;
        if (iVar8 < -0x14) {
          free(pcVar23);
          return iVar8;
        }
        pcVar15 = (char *)realloc(pcVar23,size + sVar35 + 1);
        if (pcVar15 == (char *)0x0) {
          free(pcVar23);
          pcVar23 = "Can\'t allocate memory for Symname";
          goto LAB_002294fd;
        }
        memcpy(pcVar15 + sVar35,(void *)header.dataIndex,uVar28);
        sVar35 = sVar35 + uVar28;
        pcVar23 = pcVar15;
        puVar16 = si[1].ss.digestsDefined;
      }
      if (sVar35 == 0) {
        uVar26 = *(uint *)((long)&p_Var39->unPackSize + 4) & 0xffff0fff | 0x8000;
        *(uint *)((long)&p_Var39->unPackSize + 4) = uVar26;
        archive_entry_set_mode(entry,uVar26);
      }
      else {
        pcVar23[sVar35] = '\0';
        paVar12 = archive_string_conversion_from_charset((archive_conflict *)a,"UTF-8",L'\x01');
        if (paVar12 == (archive_string_conv *)0x0) {
          free(pcVar23);
          goto LAB_0022950c;
        }
        _archive_entry_copy_symlink_l(entry,pcVar23,sVar35,paVar12);
      }
      free(pcVar23);
      archive_entry_set_size(entry,0);
    }
    *(undefined2 *)((long)&si[0xc6].pi.numPackStreams + 4) = 0x70;
    *(undefined4 *)&si[0xc6].pi.numPackStreams = 0x695a2d37;
    (a->archive).archive_format_name = (char *)&si[0xc6].pi.numPackStreams;
  }
  return iVar9;
LAB_00229f10:
  uVar34 = (ulong)uVar30;
  if (val->numFolders <= uVar34) goto LAB_0022a106;
  if ((header.emptyStreamBools == (uchar *)0x0) || (header.emptyStreamBools[uVar34] == '\0')) {
    *(byte *)(&local_a8->bindPairs + uVar34 * 10) =
         *(byte *)(&local_a8->bindPairs + uVar34 * 10) | 0x10;
  }
  uVar27 = *(uint *)(&local_a8->digest_defined + uVar34 * 0x50);
  if ((short)uVar27 < 0) {
    uVar38 = uVar27 >> 0x10;
  }
  else {
    uVar38 = 0x416d;
    if ((uVar27 & 0x10) == 0) {
      uVar38 = 0x8124;
    }
    uVar38 = uVar38 | (uint)((uVar27 & 1) == 0) << 7;
  }
  puVar18 = &local_a8->numCoders + uVar34 * 10;
  *(uint *)((long)puVar18 + 0x44) = uVar38;
  if ((*(uint *)(puVar18 + 3) & 0x10) == 0) {
    if (header.emptyFileBools == (uchar *)0x0) {
      if (uVar38 != 0) {
        bVar40 = false;
        goto LAB_0022a00e;
      }
LAB_0022a03e:
      uVar38 = 0x41ff;
LAB_0022a044:
      *(uint *)((long)puVar18 + 0x44) = uVar38;
LAB_0022a048:
      uVar34 = *puVar18;
      if ((1 < uVar34) &&
         ((p_Var21 = (_7z_coder *)puVar18[1], *(char *)((long)p_Var21 + (uVar34 - 2)) != '/' ||
          (*(char *)((long)p_Var21 + (uVar34 - 1)) != '\0')))) {
        *(undefined1 *)((long)&p_Var21->codec + uVar34) = 0x2f;
        *(undefined1 *)((long)&((_7z_coder *)puVar18[1])->codec + *puVar18 + 1) = 0;
        *puVar18 = *puVar18 + 2;
        uVar27 = *(uint *)(puVar18 + 9);
      }
    }
    else {
      lVar33 = (long)iVar8;
      bVar40 = header.emptyFileBools[lVar33] != '\0';
      iVar8 = iVar8 + 1;
      if (uVar38 != 0) {
LAB_0022a00e:
        if (((uVar38 & 0xf000) != 0x4000) && (!bVar40)) {
          uVar38 = uVar38 & 0xfff | 0x4000;
          goto LAB_0022a044;
        }
        if ((uVar38 & 0xf000) != 0x4000) goto LAB_0022a07b;
        goto LAB_0022a048;
      }
      if (header.emptyFileBools[lVar33] == '\0') goto LAB_0022a03e;
      *(undefined4 *)((long)puVar18 + 0x44) = 0x81b6;
    }
LAB_0022a07b:
    *(undefined4 *)((long)puVar18 + 0x14) = 0xffffffff;
  }
  else {
    if ((si_00->ss).unpack_streams <= (ulong)(long)iVar9) goto LAB_00229ec0;
    if (uVar38 == 0) {
      *(undefined4 *)((long)puVar18 + 0x44) = 0x81b6;
    }
    if ((si_00->ss).digestsDefined[iVar9] != '\0') {
      *(uint *)(puVar18 + 3) = *(uint *)(puVar18 + 3) | 8;
    }
    *(int *)((long)puVar18 + 0x14) = iVar9;
    iVar9 = iVar9 + 1;
  }
  if ((uVar27 & 1) != 0) {
    *(byte *)((long)puVar18 + 0x44) = *(byte *)((long)puVar18 + 0x44) & 0x6d;
  }
  if (((ulong)puVar18[3] & 0x10) == 0 && uVar31 == 0) {
    *(undefined4 *)(puVar18 + 2) = 0xffffffff;
    uVar31 = 0;
  }
  else {
    if (uVar31 == 0) {
      while( true ) {
        if ((si_00->ci).numFolders <= (ulong)uVar26) goto LAB_00229ec0;
        if (p_Var39[uVar26].numUnpackStreams != 0) break;
        uVar26 = uVar26 + 1;
      }
    }
    *(uint *)(puVar18 + 2) = uVar26;
    if (((ulong)puVar18[3] & 0x10) != 0) {
      uVar31 = uVar31 + 1;
      uVar32 = (ulong)uVar31;
      uVar34 = p_Var39[uVar26].numUnpackStreams;
      if (uVar34 <= uVar32) {
        uVar31 = 0;
      }
      uVar26 = uVar26 + (uVar34 <= uVar32);
    }
  }
  uVar30 = uVar30 + 1;
  goto LAB_00229f10;
}

Assistant:

static int
archive_read_format_7zip_read_header(struct archive_read *a,
	struct archive_entry *entry)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	struct _7zip_entry *zip_entry;
	int r, ret = ARCHIVE_OK;
	struct _7z_folder *folder = 0;
	uint64_t fidx = 0;

	/*
	 * It should be sufficient to call archive_read_next_header() for
	 * a reader to determine if an entry is encrypted or not. If the
	 * encryption of an entry is only detectable when calling
	 * archive_read_data(), so be it. We'll do the same check there
	 * as well.
	 */
	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	a->archive.archive_format = ARCHIVE_FORMAT_7ZIP;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "7-Zip";

	if (zip->entries == NULL) {
		struct _7z_header_info header;

		memset(&header, 0, sizeof(header));
		r = slurp_central_directory(a, zip, &header);
		free_Header(&header);
		if (r != ARCHIVE_OK)
			return (r);
		zip->entries_remaining = (size_t)zip->numFiles;
		zip->entry = zip->entries;
	} else {
		++zip->entry;
	}
	zip_entry = zip->entry;

	if (zip->entries_remaining <= 0 || zip_entry == NULL)
		return ARCHIVE_EOF;
	--zip->entries_remaining;

	zip->entry_offset = 0;
	zip->end_of_entry = 0;
	zip->entry_crc32 = crc32(0, NULL, 0);

	/* Setup a string conversion for a filename. */
	if (zip->sconv == NULL) {
		zip->sconv = archive_string_conversion_from_charset(
		    &a->archive, "UTF-16LE", 1);
		if (zip->sconv == NULL)
			return (ARCHIVE_FATAL);
	}

	/* Figure out if the entry is encrypted by looking at the folder
	   that is associated to the current 7zip entry. If the folder
	   has a coder with a _7Z_CRYPTO codec then the folder is encrypted.
	   Hence the entry must also be encrypted. */
	if (zip_entry && zip_entry->folderIndex < zip->si.ci.numFolders) {
		folder = &(zip->si.ci.folders[zip_entry->folderIndex]);
		for (fidx=0; folder && fidx<folder->numCoders; fidx++) {
			switch(folder->coders[fidx].codec) {
				case _7Z_CRYPTO_MAIN_ZIP:
				case _7Z_CRYPTO_RAR_29:
				case _7Z_CRYPTO_AES_256_SHA_256: {
					archive_entry_set_is_data_encrypted(entry, 1);
					zip->has_encrypted_entries = 1;
					break;
				}
			}
		}
	}

	/* Now that we've checked for encryption, if there were still no
	 * encrypted entries found we can say for sure that there are none.
	 */
	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	if (archive_entry_copy_pathname_l(entry,
	    (const char *)zip_entry->utf16name,
	    zip_entry->name_len, zip->sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Pathname cannot be converted "
		    "from %s to current locale.",
		    archive_string_conversion_charset_name(zip->sconv));
		ret = ARCHIVE_WARN;
	}

	/* Populate some additional entry fields: */
	archive_entry_set_mode(entry, zip_entry->mode);
	if (zip_entry->flg & MTIME_IS_SET)
		archive_entry_set_mtime(entry, zip_entry->mtime,
			zip_entry->mtime_ns);
	if (zip_entry->flg & CTIME_IS_SET)
		archive_entry_set_ctime(entry, zip_entry->ctime,
		    zip_entry->ctime_ns);
	if (zip_entry->flg & ATIME_IS_SET)
		archive_entry_set_atime(entry, zip_entry->atime,
		    zip_entry->atime_ns);
	if (zip_entry->ssIndex != (uint32_t)-1) {
		zip->entry_bytes_remaining =
		    zip->si.ss.unpackSizes[zip_entry->ssIndex];
		archive_entry_set_size(entry, zip->entry_bytes_remaining);
	} else {
		zip->entry_bytes_remaining = 0;
		archive_entry_set_size(entry, 0);
	}

	// These attributes are supported by the windows implementation of archive_write_disk.
	const int supported_attrs = FILE_ATTRIBUTE_READONLY | FILE_ATTRIBUTE_HIDDEN | FILE_ATTRIBUTE_SYSTEM;

	if (zip_entry->attr & supported_attrs) {
		char *fflags_text, *ptr;
		/* allocate for ",rdonly,hidden,system" */
		fflags_text = malloc(22 * sizeof(*fflags_text));
		if (fflags_text != NULL) {
			ptr = fflags_text;
			if (zip_entry->attr & FILE_ATTRIBUTE_READONLY) {
				strcpy(ptr, ",rdonly");
				ptr = ptr + 7;
			}
			if (zip_entry->attr & FILE_ATTRIBUTE_HIDDEN) {
				strcpy(ptr, ",hidden");
				ptr = ptr + 7;
			}
			if (zip_entry->attr & FILE_ATTRIBUTE_SYSTEM) {
				strcpy(ptr, ",system");
				ptr = ptr + 7;
			}
			if (ptr > fflags_text) {
				archive_entry_copy_fflags_text(entry,
				    fflags_text + 1);
			}
			free(fflags_text);
		}
	}

	/* If there's no body, force read_data() to return EOF immediately. */
	if (zip->entry_bytes_remaining < 1)
		zip->end_of_entry = 1;

	if ((zip_entry->mode & AE_IFMT) == AE_IFLNK) {
		unsigned char *symname = NULL;
		size_t symsize = 0;

		/*
		 * Symbolic-name is recorded as its contents. We have to
		 * read the contents at this time.
		 */
		while (zip->entry_bytes_remaining > 0) {
			const void *buff;
			unsigned char *mem;
			size_t size;
			int64_t offset;

			r = archive_read_format_7zip_read_data(a, &buff,
				&size, &offset);
			if (r < ARCHIVE_WARN) {
				free(symname);
				return (r);
			}
			mem = realloc(symname, symsize + size + 1);
			if (mem == NULL) {
				free(symname);
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Symname");
				return (ARCHIVE_FATAL);
			}
			symname = mem;
			memcpy(symname+symsize, buff, size);
			symsize += size;
		}
		if (symsize == 0) {
			/* If there is no symname, handle it as a regular
			 * file. */
			zip_entry->mode &= ~AE_IFMT;
			zip_entry->mode |= AE_IFREG;
			archive_entry_set_mode(entry, zip_entry->mode);
		} else {
			struct archive_string_conv* utf8_conv;

			symname[symsize] = '\0';

			/* Symbolic links are embedded as UTF-8 strings */
			utf8_conv = archive_string_conversion_from_charset(&a->archive,
			    "UTF-8", 1);
			if (utf8_conv == NULL) {
				free(symname);
				return ARCHIVE_FATAL;
			}

			archive_entry_copy_symlink_l(entry, (const char*)symname, symsize,
			    utf8_conv);
		}
		free(symname);
		archive_entry_set_size(entry, 0);
	}

	/* Set up a more descriptive format name. */
	snprintf(zip->format_name, sizeof(zip->format_name), "7-Zip");
	a->archive.archive_format_name = zip->format_name;

	return (ret);
}